

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2NotationDecl(void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId)

{
  uint uVar1;
  char *msg;
  xmlNotationPtr nota;
  long lVar2;
  
  if (ctx == (void *)0x0) {
    return;
  }
  if (*(long *)((long)ctx + 0x10) == 0) {
    return;
  }
  if (publicId == (xmlChar *)0x0 && systemId == (xmlChar *)0x0) {
    msg = "SAX.xmlSAX2NotationDecl(%s) externalID or PublicID missing\n";
LAB_00147a06:
    xmlCtxtErr((xmlParserCtxtPtr)ctx,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NOTATION_PROCESSING,
               XML_ERR_FATAL,name,(xmlChar *)0x0,(xmlChar *)0x0,0,msg,name,0);
  }
  else {
    if (*(int *)((long)ctx + 0x150) == 1) {
      lVar2 = 0x50;
    }
    else {
      if (*(int *)((long)ctx + 0x150) != 2) {
        msg = "SAX.xmlSAX2NotationDecl(%s) called while not in subset\n";
        goto LAB_00147a06;
      }
      lVar2 = 0x58;
    }
    nota = xmlAddNotationDecl((xmlValidCtxtPtr)((long)ctx + 0xa0),
                              *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + lVar2),name,publicId,
                              systemId);
    if (nota == (xmlNotationPtr)0x0) {
      *(undefined4 *)((long)ctx + 0x98) = 0;
    }
    if (((*(int *)((long)ctx + 0x9c) != 0) && (*(int *)((long)ctx + 0x18) != 0)) &&
       ((*(xmlDocPtr *)((long)ctx + 0x10))->intSubset != (_xmlDtd *)0x0)) {
      uVar1 = xmlValidateNotationDecl
                        ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),nota);
      *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar1;
    }
  }
  return;
}

Assistant:

void
xmlSAX2NotationDecl(void *ctx, const xmlChar *name,
	     const xmlChar *publicId, const xmlChar *systemId)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNotationPtr nota = NULL;

    /* Avoid unused variable warning if features are disabled. */
    (void) nota;

    if ((ctxt == NULL) || (ctxt->myDoc == NULL))
        return;

    if ((publicId == NULL) && (systemId == NULL)) {
	xmlFatalErrMsg(ctxt, XML_ERR_NOTATION_PROCESSING,
	     "SAX.xmlSAX2NotationDecl(%s) externalID or PublicID missing\n",
	               name, NULL);
	return;
    } else if (ctxt->inSubset == 1)
	nota = xmlAddNotationDecl(&ctxt->vctxt, ctxt->myDoc->intSubset, name,
                              publicId, systemId);
    else if (ctxt->inSubset == 2)
	nota = xmlAddNotationDecl(&ctxt->vctxt, ctxt->myDoc->extSubset, name,
                              publicId, systemId);
    else {
	xmlFatalErrMsg(ctxt, XML_ERR_NOTATION_PROCESSING,
	     "SAX.xmlSAX2NotationDecl(%s) called while not in subset\n",
	               name, NULL);
	return;
    }
#ifdef LIBXML_VALID_ENABLED
    if (nota == NULL) ctxt->valid = 0;
    if ((ctxt->validate) && (ctxt->wellFormed) &&
        (ctxt->myDoc->intSubset != NULL))
	ctxt->valid &= xmlValidateNotationDecl(&ctxt->vctxt, ctxt->myDoc,
	                                       nota);
#endif /* LIBXML_VALID_ENABLED */
}